

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.h
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
mvm::assembler<mvm::test::test_instr_set,mvm::bytecode_serializer>::
assemble_instr<mvm::instr_set<mvm::test::test_instr_set>::consumer_producer_pipe<mvm::meta_tie<mvm::meta_bytecode,unsigned_int>,mvm::meta_tie<mvm::meta_value_stack,unsigned_int>,mvm::typestring::type_string<(char)112,(char)117,(char)115,(char)104,(char)0>>>
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          assembler<mvm::test::test_instr_set,mvm::bytecode_serializer> *this,uint8_t i,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *attributes)

{
  undefined8 *puVar1;
  initializer_list<unsigned_char> __l;
  allocator_type local_39;
  string local_38 [32];
  
  __l._M_len = 1;
  __l._M_array = (iterator)local_38;
  local_38[0] = (string)i;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,__l,&local_39);
  if ((long)(attributes->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(attributes->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start == 0x20) {
    assemble_operands<mvm::instr_set<mvm::test::test_instr_set>::consumer_producer_pipe<mvm::meta_tie<mvm::meta_bytecode,unsigned_int>,mvm::meta_tie<mvm::meta_value_stack,unsigned_int>,mvm::typestring::type_string<(char)112,(char)117,(char)115,(char)104,(char)0>>,0ul>
              (this,__return_storage_ptr__,attributes);
    return __return_storage_ptr__;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            (local_38,"[-][mvm] invalid instruction operands",(allocator<char> *)&local_39);
  *puVar1 = &PTR__mexcept_00178098;
  *(undefined2 *)(puVar1 + 1) = 4;
  __cxa_throw(puVar1,&mexcept::typeinfo,mexcept::~mexcept);
}

Assistant:

std::vector<uint8_t> assembler<Set, MetaCodeImpl>::assemble_instr(
    uint8_t i, std::vector<std::string> const &attributes) const {
  std::vector<uint8_t> bytes = {i};

  if constexpr (concept ::is_code_consumer<I>()) {
    using cc_type = typename I::bytecode_type;

    if (attributes.size() != list::size_v<cc_type>) {
      throw mexcept("[-][mvm] invalid instruction operands",
                    status_type::BAD_INSTR_OPERAND);
    }

    assemble_operands<I>(bytes, attributes,
                         std::make_index_sequence<list::size_v<cc_type>>());
  } else {
    if (attributes.size() != 0) {
      throw mexcept("[-][mvm] invalid instruction operands",
                    status_type::BAD_INSTR_OPERAND);
    }
  }

  return bytes;
}